

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O0

void __thiscall QPrintDialogPrivate::QPrintDialogPrivate(QPrintDialogPrivate *this)

{
  QAbstractPrintDialogPrivate *in_RDI;
  
  QAbstractPrintDialogPrivate::QAbstractPrintDialogPrivate(in_RDI);
  *(undefined ***)in_RDI = &PTR__QPrintDialogPrivate_001aa568;
  *(undefined8 *)&in_RDI[1].field_0x168 = 0;
  *(undefined8 *)&in_RDI[1].field_0x170 = 0;
  *(undefined8 *)&in_RDI[1].field_0x178 = 0;
  *(undefined8 *)&in_RDI[1].field_0x180 = 0;
  *(undefined4 *)&in_RDI[1].field_0x18c = 1;
  _q_pdu_initResources();
  return;
}

Assistant:

QPrintDialogPrivate::QPrintDialogPrivate()
    : top(nullptr), bottom(nullptr), buttons(nullptr), collapseButton(nullptr),
      explicitDuplexMode(QPrint::DuplexAuto)
{
    _q_pdu_initResources();
}